

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O1

Vec_Ptr_t * Cec_ManPatPackPatterns(Vec_Int_t *vCexStore,int nInputs,int nRegs,int nWordsInit)

{
  int iVar1;
  int iVar2;
  int iWordStart;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  void **ppvVar5;
  void **ppvVar6;
  Vec_Ptr_t *vInfo;
  Vec_Ptr_t *vPres;
  void **ppvVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  size_t __size;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  
  if (nInputs < nRegs) {
    __assert_fail("nRegs <= nInputs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                  ,0x209,"Vec_Ptr_t *Cec_ManPatPackPatterns(Vec_Int_t *, int, int, int)");
  }
  uVar15 = (ulong)(uint)nInputs;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  lVar14 = (long)nWordsInit;
  lVar9 = (long)nInputs;
  __size = (lVar14 * 4 + 8) * lVar9;
  ppvVar5 = (void **)malloc(__size);
  if (0 < nInputs) {
    ppvVar6 = ppvVar5 + lVar9;
    ppvVar7 = ppvVar5;
    uVar12 = uVar15;
    do {
      *ppvVar7 = ppvVar6;
      ppvVar7 = ppvVar7 + 1;
      ppvVar6 = (void **)((long)ppvVar6 + lVar14 * 4);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  vInfo = (Vec_Ptr_t *)malloc(0x10);
  vInfo->nSize = nInputs;
  vInfo->nCap = nInputs;
  vInfo->pArray = ppvVar5;
  if (0 < nInputs) {
    lVar11 = 0;
    do {
      memset(vInfo->pArray[lVar11],0,(long)(nWordsInit * 4));
      lVar11 = lVar11 + 1;
    } while (lVar11 < vInfo->nSize);
  }
  Gia_ManRandomInfo(vInfo,nRegs,0,nWordsInit);
  ppvVar5 = (void **)malloc(__size);
  if (0 < nInputs) {
    ppvVar6 = ppvVar5 + lVar9;
    ppvVar7 = ppvVar5;
    do {
      *ppvVar7 = ppvVar6;
      ppvVar7 = ppvVar7 + 1;
      ppvVar6 = (void **)((long)ppvVar6 + lVar14 * 4);
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  vPres = (Vec_Ptr_t *)malloc(0x10);
  vPres->nSize = nInputs;
  vPres->nCap = nInputs;
  vPres->pArray = ppvVar5;
  if (0 < nInputs) {
    lVar14 = 0;
    do {
      memset(ppvVar5[lVar14],0,(long)(nWordsInit * 4));
      lVar14 = lVar14 + 1;
    } while (lVar9 != lVar14);
  }
  iVar13 = 0;
  iVar2 = nWordsInit << 5;
  iWordStart = nWordsInit;
  do {
    do {
      iVar10 = iVar13;
      do {
        iVar16 = iVar10;
        if (vCexStore->nSize <= iVar16) {
          if (vPres->pArray != (void **)0x0) {
            free(vPres->pArray);
            vPres->pArray = (void **)0x0;
          }
          free(vPres);
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
            p->pArray = (int *)0x0;
          }
          free(p);
          return vInfo;
        }
        if ((iVar13 < -1) || (vCexStore->nSize <= (int)(iVar16 + 1U))) goto LAB_005cdf84;
        iVar1 = vCexStore->pArray[iVar16 + 1U];
        iVar10 = iVar16 + 2;
      } while (iVar1 < 1);
      uVar8 = iVar16 + 2;
      p->nSize = 0;
      uVar15 = (ulong)uVar8;
      iVar13 = iVar1 + uVar8;
      iVar10 = 0;
      do {
        if (((int)uVar8 < 0) || (vCexStore->nSize <= iVar16 + 2 + iVar10)) {
LAB_005cdf84:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p,vCexStore->pArray[uVar15]);
        iVar10 = iVar10 + 1;
        uVar15 = uVar15 + 1;
      } while (iVar1 != iVar10);
      iVar10 = 1;
      if (1 < iVar2) {
        piVar4 = p->pArray;
        iVar16 = p->nSize;
        iVar10 = 1;
        do {
          iVar3 = Cec_ManPatCollectTry(vInfo,vPres,iVar10,piVar4,iVar16);
          if (iVar3 != 0) break;
          iVar10 = iVar10 + 1 + (uint)((iVar10 + 1) % (nWordsInit << 5) == 0);
        } while (iVar10 < iVar2);
      }
    } while (iVar10 != iVar2 + -1);
    Vec_PtrReallocSimInfo(vInfo);
    if (0 < vInfo->nSize) {
      lVar9 = 0;
      do {
        memset((void *)((long)vInfo->pArray[lVar9] + (long)(iWordStart * 4)),0,
               (long)(iWordStart * 4));
        lVar9 = lVar9 + 1;
      } while (lVar9 < vInfo->nSize);
    }
    Gia_ManRandomInfo(vInfo,nRegs,iWordStart,iWordStart * 2);
    Vec_PtrReallocSimInfo(vPres);
    iVar13 = vPres->nSize;
    if (0 < (long)iVar13) {
      ppvVar5 = vPres->pArray;
      lVar9 = 0;
      do {
        memset((void *)((long)ppvVar5[lVar9] + (long)(iWordStart << 2)),0,(long)(iWordStart << 2));
        lVar9 = lVar9 + 1;
      } while (iVar13 != lVar9);
    }
    iVar13 = iVar1 + uVar8;
    iVar2 = iVar2 * 2;
    iWordStart = iWordStart * 2;
  } while( true );
}

Assistant:

Vec_Ptr_t * Cec_ManPatPackPatterns( Vec_Int_t * vCexStore, int nInputs, int nRegs, int nWordsInit )
{
    Vec_Int_t * vPat;
    Vec_Ptr_t * vInfo, * vPres;
    int k, nSize, iStart, kMax = 0, nPatterns = 0;
    int nWords = nWordsInit;
    int nBits = 32 * nWords;
//    int RetValue;
    assert( nRegs <= nInputs );
    vPat  = Vec_IntAlloc( 100 );

    vInfo = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vInfo, 0, nWords );
    Gia_ManRandomInfo( vInfo, nRegs, 0, nWords );

    vPres = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    iStart = 0;
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        nPatterns++;
        // skip the output number
        iStart++;
        // get the number of items
        nSize = Vec_IntEntry( vCexStore, iStart++ );
        if ( nSize <= 0 )
            continue;
        // extract pattern
        Vec_IntClear( vPat );
        for ( k = 0; k < nSize; k++ )
            Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
        // add pattern to storage
        for ( k = 1; k < nBits; k++, k += ((k % (32 * nWordsInit)) == 0) )
            if ( Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;

//        k = kMax + 1;
//        RetValue = Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) );
//        assert( RetValue == 1 );

        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
        {
            Vec_PtrReallocSimInfo( vInfo );
            Vec_PtrCleanSimInfo( vInfo, nWords, 2*nWords );
            Gia_ManRandomInfo( vInfo, nRegs, nWords, 2*nWords );

            Vec_PtrReallocSimInfo( vPres );
            Vec_PtrCleanSimInfo( vPres, nWords, 2*nWords );
            nWords *= 2;
            nBits *= 2;
        }
    }
//    Abc_Print( 1, "packed %d patterns into %d vectors (out of %d)\n", nPatterns, kMax, nBits );
    Vec_PtrFree( vPres );
    Vec_IntFree( vPat );
    return vInfo;
}